

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void nn_hash_init(nn_hash *self)

{
  nn_list *pnVar1;
  long lVar2;
  
  self->slots = 0x20;
  self->items = 0;
  pnVar1 = (nn_list *)nn_alloc_(0x200);
  self->array = pnVar1;
  if (pnVar1 != (nn_list *)0x0) {
    for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 0x10) {
      nn_list_init((nn_list *)((long)&self->array->first + lVar2));
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/hash.c"
          ,0x29);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_hash_init (struct nn_hash *self)
{
    uint32_t i;

    self->slots = NN_HASH_INITIAL_SLOTS;
    self->items = 0;
    self->array = nn_alloc (sizeof (struct nn_list) * NN_HASH_INITIAL_SLOTS,
        "hash map");
    alloc_assert (self->array);
    for (i = 0; i != NN_HASH_INITIAL_SLOTS; ++i)
        nn_list_init (&self->array [i]);
}